

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  size_t sVar2;
  FilePath *in_RDI;
  char *__s;
  char local_1058 [8];
  char cwd [4097];
  long *local_48 [2];
  long local_38 [2];
  
  memset(local_1058,0,0x1001);
  pcVar1 = getcwd(local_1058,0x1001);
  __s = "";
  if (pcVar1 != (char *)0x0) {
    __s = local_1058;
  }
  local_48[0] = local_38;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,__s + sVar2);
  (in_RDI->pathname_)._M_dataplus._M_p = (pointer)&(in_RDI->pathname_).field_2;
  std::__cxx11::string::_M_construct<char*>();
  Normalize(in_RDI);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_WINDOWS_PHONE ||         \
    GTEST_OS_WINDOWS_RT || GTEST_OS_ESP8266 || GTEST_OS_ESP32 || \
    GTEST_OS_XTENSA
  // These platforms do not have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == nullptr ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  char* result = getcwd(cwd, sizeof(cwd));
# if GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == nullptr ? kCurrentDirectoryString : cwd);
# endif  // GTEST_OS_NACL
  return FilePath(result == nullptr ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}